

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkleblock_tests.cpp
# Opt level: O1

void __thiscall
merkleblock_tests::merkleblock_construct_from_txids_not_found::test_method
          (merkleblock_construct_from_txids_not_found *this)

{
  long lVar1;
  int iVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  bool bVar5;
  readonly_property<bool> rVar6;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vIndex;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  lazy_ostream local_2d8;
  undefined1 *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  vector<uint256,_std::allocator<uint256>_> vMatched;
  string *local_280;
  string *local_278;
  string *local_270;
  char *local_268;
  undefined **local_260;
  undefined1 local_258;
  undefined1 *local_250;
  string **local_248;
  undefined1 local_240 [16];
  shared_count asStack_230 [2];
  undefined1 local_220 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  undefined1 local_200 [32];
  string local_1e0;
  CMerkleBlock merkleBlock;
  undefined1 local_108 [24];
  string **ppsStack_f0;
  undefined1 local_e8;
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  txids2;
  CBlock block;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  getBlock13b8a();
  txids2._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &txids2._M_t._M_impl.super__Rb_tree_header._M_header;
  txids2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  txids2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  txids2._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  txids2._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       txids2._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  detail::FromHex<uint256>
            ((optional<uint256> *)&merkleBlock,(detail *)0x40,(string_view)ZEXT816(0xecde58));
  local_e8 = merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1c] == '\x01';
  if ((bool)local_e8) {
    local_108[0x10] = merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc];
    local_108[0x11] = merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd];
    local_108[0x12] = merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe];
    local_108[0x13] = merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf];
    local_108[0x14] = merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10];
    local_108[0x15] = merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11];
    local_108[0x16] = merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12];
    local_108[0x17] = merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13];
    ppsStack_f0 = (string **)
                  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._20_8_;
    local_108._0_4_ = merkleBlock.header.nVersion;
    local_108[4] = merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0];
    local_108[5] = merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1];
    local_108[6] = merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2];
    local_108[7] = merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3];
    local_108[8] = merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4];
    local_108[9] = merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5];
    local_108[10] = merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6];
    local_108[0xb] = merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7];
    local_108[0xc] = merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8];
    local_108[0xd] = merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9];
    local_108[0xe] = merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10];
    local_108[0xf] = merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb];
    std::
    _Rb_tree<transaction_identifier<false>,transaction_identifier<false>,std::_Identity<transaction_identifier<false>>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>
    ::_M_insert_unique<transaction_identifier<false>>
              ((_Rb_tree<transaction_identifier<false>,transaction_identifier<false>,std::_Identity<transaction_identifier<false>>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>
                *)&txids2,(transaction_identifier<false> *)local_108);
    CMerkleBlock::CMerkleBlock(&merkleBlock,&block,(CBloomFilter *)0x0,&txids2);
    local_2a8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkleblock_tests.cpp"
    ;
    local_2a0 = "";
    local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x45;
    file.m_begin = (iterator)&local_2a8;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2b8,msg);
    local_2d8.m_empty = false;
    local_2d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
    local_2c8 = boost::unit_test::lazy_ostream::inst;
    local_2c0 = "";
    CBlockHeader::GetHash((uint256 *)local_200,&merkleBlock.header);
    base_blob<256u>::GetHex_abi_cxx11_(&local_1e0,local_200);
    CBlockHeader::GetHash((uint256 *)local_240,&block.super_CBlockHeader);
    base_blob<256u>::GetHex_abi_cxx11_((string *)local_220,local_240);
    if (local_1e0._M_string_length == local_220._8_8_) {
      if (local_1e0._M_string_length == 0) {
        bVar5 = true;
      }
      else {
        iVar2 = bcmp((void *)CONCAT71(local_1e0._M_dataplus._M_p._1_7_,
                                      local_1e0._M_dataplus._M_p._0_1_),(void *)local_220._0_8_,
                     local_1e0._M_string_length);
        bVar5 = iVar2 == 0;
      }
    }
    else {
      bVar5 = false;
    }
    vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT71(vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>.
                                 _M_impl.super__Vector_impl_data._M_start._1_7_,bVar5);
    vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_c954ec;
    vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xecdcb3;
    ppsStack_f0 = &local_270;
    local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
    local_108._0_8_ = &PTR__lazy_ostream_013d3d70;
    local_108._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_248 = &local_278;
    local_278 = (string *)local_220;
    local_258 = 0;
    local_260 = &PTR__lazy_ostream_013d3d70;
    local_250 = boost::unit_test::lazy_ostream::inst;
    pvVar3 = (iterator)0x1;
    pvVar4 = (iterator)0x2;
    local_270 = &local_1e0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&vMatched,&local_2d8,1,2,REQUIRE,0xe95598,(size_t)&vIndex,0x45,
               local_108,"block.GetHash().GetHex()",&local_260);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
      operator_delete((void *)local_220._0_8_,local_210._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1e0._M_dataplus._M_p._1_7_,local_1e0._M_dataplus._M_p._0_1_) !=
        &local_1e0.field_2) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_1e0._M_dataplus._M_p._1_7_,local_1e0._M_dataplus._M_p._0_1_)
                      ,local_1e0.field_2._M_allocated_capacity + 1);
    }
    local_2e8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkleblock_tests.cpp"
    ;
    local_2e0 = "";
    local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x46;
    file_00.m_begin = (iterator)&local_2e8;
    msg_00.m_end = pvVar4;
    msg_00.m_begin = pvVar3;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2f8,
               msg_00);
    vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)(((long)merkleBlock.vMatchedTxn.
                                super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)merkleBlock.vMatchedTxn.
                                super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 2) *
                        -0x71c71c71c71c71c7);
    local_1e0._M_dataplus._M_p._0_1_ =
         merkleBlock.vMatchedTxn.
         super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
         ._M_impl.super__Vector_impl_data._M_finish ==
         merkleBlock.vMatchedTxn.
         super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_2d8.m_empty = false;
    local_2d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
    local_2c8 = boost::unit_test::lazy_ostream::inst;
    local_2c0 = "";
    vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    local_1e0._M_string_length = 0;
    local_1e0.field_2._M_allocated_capacity = 0;
    local_200._0_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkleblock_tests.cpp"
    ;
    local_200._8_8_ = "";
    local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
    local_108._0_8_ = &PTR__lazy_ostream_013d3cf0;
    local_108._16_8_ = boost::unit_test::lazy_ostream::inst;
    ppsStack_f0 = (string **)local_220;
    local_258 = 0;
    local_260 = &PTR__lazy_ostream_013d3d30;
    local_250 = boost::unit_test::lazy_ostream::inst;
    pvVar3 = (iterator)0x1;
    pvVar4 = (iterator)0x2;
    local_248 = (string **)local_240;
    local_240._0_8_ = &vIndex;
    local_220._0_8_ = (assertion_result *)&vMatched;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_1e0,&local_2d8,1,2,REQUIRE,0xe956ca,(size_t)local_200,0x46
               ,local_108,"0U",&local_260);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_1e0.field_2._M_allocated_capacity);
    vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_328 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkleblock_tests.cpp"
    ;
    local_320 = "";
    local_338 = &boost::unit_test::basic_cstring<char_const>::null;
    local_330 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x4b;
    file_01.m_begin = (iterator)&local_328;
    msg_01.m_end = pvVar4;
    msg_01.m_begin = pvVar3;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_338,
               msg_01);
    local_2d8.m_empty = false;
    local_2d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
    local_2c8 = boost::unit_test::lazy_ostream::inst;
    local_2c0 = "";
    CPartialMerkleTree::ExtractMatches((uint256 *)local_200,&merkleBlock.txn,&vMatched,&vIndex);
    base_blob<256u>::GetHex_abi_cxx11_(&local_1e0,local_200);
    base_blob<256u>::GetHex_abi_cxx11_((string *)local_220,&block.super_CBlockHeader.hashMerkleRoot)
    ;
    if (local_1e0._M_string_length == local_220._8_8_) {
      if (local_1e0._M_string_length == 0) {
        rVar6.super_class_property<bool>.value = (class_property<bool>)true;
      }
      else {
        iVar2 = bcmp((void *)CONCAT71(local_1e0._M_dataplus._M_p._1_7_,
                                      local_1e0._M_dataplus._M_p._0_1_),(void *)local_220._0_8_,
                     local_1e0._M_string_length);
        rVar6.super_class_property<bool>.value = (class_property<bool>)(iVar2 == 0);
      }
    }
    else {
      rVar6.super_class_property<bool>.value = (class_property<bool>)false;
    }
    local_240[0] = rVar6.super_class_property<bool>.value;
    local_240._8_8_ = (element_type *)0x0;
    asStack_230[0].pi_ = (sp_counted_base *)0x0;
    local_270 = (string *)0xecdc50;
    local_268 = "";
    local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
    local_108._0_8_ = &PTR__lazy_ostream_013d3d70;
    local_108._16_8_ = boost::unit_test::lazy_ostream::inst;
    ppsStack_f0 = &local_278;
    local_248 = &local_280;
    local_258 = 0;
    local_260 = &PTR__lazy_ostream_013d3d70;
    local_250 = boost::unit_test::lazy_ostream::inst;
    pvVar3 = (iterator)0x1;
    pvVar4 = (iterator)0x2;
    local_280 = (string *)local_220;
    local_278 = &local_1e0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_240,&local_2d8,1,2,REQUIRE,0xecdd5d,(size_t)&local_270,0x4b
               ,local_108,"block.hashMerkleRoot.GetHex()",&local_260);
    boost::detail::shared_count::~shared_count(asStack_230);
    if ((assertion_result *)local_220._0_8_ != (assertion_result *)(local_220 + 0x10)) {
      operator_delete((void *)local_220._0_8_,local_210._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1e0._M_dataplus._M_p._1_7_,local_1e0._M_dataplus._M_p._0_1_) !=
        &local_1e0.field_2) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_1e0._M_dataplus._M_p._1_7_,local_1e0._M_dataplus._M_p._0_1_)
                      ,local_1e0.field_2._M_allocated_capacity + 1);
    }
    local_348 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkleblock_tests.cpp"
    ;
    local_340 = "";
    local_358 = &boost::unit_test::basic_cstring<char_const>::null;
    local_350 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x4c;
    file_02.m_begin = (iterator)&local_348;
    msg_02.m_end = pvVar4;
    msg_02.m_begin = pvVar3;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_358,
               msg_02);
    local_270 = (string *)
                ((long)vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Vector_impl_data._M_start >> 5);
    local_1e0._M_dataplus._M_p._0_1_ =
         vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
         super__Vector_impl_data._M_finish ==
         vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_2d8.m_empty = false;
    local_2d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
    local_2c8 = boost::unit_test::lazy_ostream::inst;
    local_2c0 = "";
    local_278 = (string *)((ulong)local_278 & 0xffffffff00000000);
    local_1e0._M_string_length = 0;
    local_1e0.field_2._M_allocated_capacity = 0;
    local_200._0_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkleblock_tests.cpp"
    ;
    local_200._8_8_ = "";
    local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
    local_108._0_8_ = &PTR__lazy_ostream_013d3cf0;
    local_108._16_8_ = boost::unit_test::lazy_ostream::inst;
    ppsStack_f0 = (string **)local_220;
    local_240._0_8_ = &local_278;
    local_258 = 0;
    local_260 = &PTR__lazy_ostream_013d3d30;
    local_250 = boost::unit_test::lazy_ostream::inst;
    pvVar3 = (iterator)0x1;
    pvVar4 = (iterator)0x2;
    local_248 = (string **)local_240;
    local_220._0_8_ = &local_270;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_1e0,&local_2d8,1,2,REQUIRE,0xecddb5,(size_t)local_200,0x4c
               ,local_108,"0U",&local_260);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_1e0.field_2._M_allocated_capacity);
    local_368 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkleblock_tests.cpp"
    ;
    local_360 = "";
    local_378 = &boost::unit_test::basic_cstring<char_const>::null;
    local_370 = &boost::unit_test::basic_cstring<char_const>::null;
    file_03.m_end = (iterator)0x4d;
    file_03.m_begin = (iterator)&local_368;
    msg_03.m_end = pvVar4;
    msg_03.m_begin = pvVar3;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_378,
               msg_03);
    local_270 = (string *)
                ((long)vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 2);
    local_1e0._M_dataplus._M_p._0_1_ =
         vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish ==
         vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_2d8.m_empty = false;
    local_2d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
    local_2c8 = boost::unit_test::lazy_ostream::inst;
    local_2c0 = "";
    local_278 = (string *)((ulong)local_278 & 0xffffffff00000000);
    local_1e0._M_string_length = 0;
    local_1e0.field_2._M_allocated_capacity = 0;
    local_200._0_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkleblock_tests.cpp"
    ;
    local_200._8_8_ = "";
    local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
    local_108._0_8_ = &PTR__lazy_ostream_013d3cf0;
    local_108._16_8_ = boost::unit_test::lazy_ostream::inst;
    ppsStack_f0 = (string **)local_220;
    local_240._0_8_ = &local_278;
    local_258 = 0;
    local_260 = &PTR__lazy_ostream_013d3d30;
    local_250 = boost::unit_test::lazy_ostream::inst;
    local_248 = (string **)local_240;
    local_220._0_8_ = &local_270;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_1e0,&local_2d8,1,2,REQUIRE,0xecde99,(size_t)local_200,0x4d
               ,local_108,"0U",&local_260);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_1e0.field_2._M_allocated_capacity);
    if (vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                      .super__Vector_impl_data._M_start,
                      (long)vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (merkleBlock.vMatchedTxn.
        super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(merkleBlock.vMatchedTxn.
                      super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)merkleBlock.vMatchedTxn.
                            super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)merkleBlock.vMatchedTxn.
                            super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (merkleBlock.txn.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(merkleBlock.txn.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)merkleBlock.txn.vHash.
                            super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)merkleBlock.txn.vHash.
                            super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (merkleBlock.txn.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(merkleBlock.txn.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)merkleBlock.txn.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl
                            .super__Bvector_impl_data._M_end_of_storage -
                      (long)merkleBlock.txn.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl
                            .super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      merkleBlock.txn.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      merkleBlock.txn.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
      merkleBlock.txn.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      merkleBlock.txn.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
      merkleBlock.txn.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    }
    std::
    _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
    ::~_Rb_tree(&txids2._M_t);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector(&block.vtx);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::__throw_bad_optional_access();
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(merkleblock_construct_from_txids_not_found)
{
    CBlock block = getBlock13b8a();

    std::set<Txid> txids2;
    txids2.insert(Txid::FromHex("c0ffee00003bafa802c8aa084379aa98d9fcd632ddc2ed9782b586ec87451f20").value());
    CMerkleBlock merkleBlock(block, txids2);

    BOOST_CHECK_EQUAL(merkleBlock.header.GetHash().GetHex(), block.GetHash().GetHex());
    BOOST_CHECK_EQUAL(merkleBlock.vMatchedTxn.size(), 0U);

    std::vector<uint256> vMatched;
    std::vector<unsigned int> vIndex;

    BOOST_CHECK_EQUAL(merkleBlock.txn.ExtractMatches(vMatched, vIndex).GetHex(), block.hashMerkleRoot.GetHex());
    BOOST_CHECK_EQUAL(vMatched.size(), 0U);
    BOOST_CHECK_EQUAL(vIndex.size(), 0U);
}